

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t driver::zeContextDestroy(ze_context_handle_t hContext)

{
  ze_pfnContextDestroy_t pfnDestroy;
  ze_result_t result;
  ze_context_handle_t hContext_local;
  
  pfnDestroy._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c2d8 != (code *)0x0) {
    pfnDestroy._4_4_ = (*DAT_0011c2d8)(hContext);
  }
  return pfnDestroy._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeContextDestroy(
        ze_context_handle_t hContext                    ///< [in][release] handle of context object to destroy
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnDestroy = context.zeDdiTable.Context.pfnDestroy;
        if( nullptr != pfnDestroy )
        {
            result = pfnDestroy( hContext );
        }
        else
        {
            // generic implementation

        }

        return result;
    }